

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

bool __thiscall
InsertProxyModel::insertColumns(InsertProxyModel *this,int column,int count,QModelIndex *parent)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  
  bVar1 = QModelIndex::isValid(parent);
  if (((!bVar1) && (lVar4 = QAbstractProxyModel::sourceModel(), lVar4 != 0)) && (-1 < column)) {
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    iVar3 = (**(code **)(*plVar5 + 0x80))(plVar5);
    if (column <= iVar3) {
      plVar5 = (long *)QAbstractProxyModel::sourceModel();
      uVar2 = (**(code **)(*plVar5 + 0x100))(plVar5,column,count);
      return (bool)uVar2;
    }
  }
  return false;
}

Assistant:

bool InsertProxyModel::insertColumns(int column, int count, const QModelIndex &parent)
{
    if (parent.isValid())
        return false;
    if (!sourceModel())
        return false;
    if (column < 0 || column > sourceModel()->columnCount())
        return false;
    return sourceModel()->insertColumns(column, count);
}